

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.cpp
# Opt level: O2

void __thiscall IZDeflate::gen_bitlen(IZDeflate *this,tree_desc *desc)

{
  short *psVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ct_data *pcVar8;
  ct_data *pcVar9;
  int *piVar10;
  bool bVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  ush *puVar20;
  
  pcVar8 = desc->dyn_tree;
  pcVar9 = desc->static_tree;
  piVar10 = desc->extra_bits;
  iVar4 = desc->extra_base;
  iVar5 = desc->max_code;
  iVar6 = desc->max_length;
  lVar12 = (long)iVar6;
  for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 1) {
    this->bl_count[lVar14] = 0;
  }
  pcVar8[this->heap[this->heap_max]].dl.dad = 0;
  uVar13 = this->heap_max;
  lVar14 = (long)(int)uVar13;
  iVar16 = 0;
  while( true ) {
    uVar13 = uVar13 + 1;
    uVar15 = (ulong)uVar13;
    if (0x23b < lVar14) break;
    iVar7 = this->heap[lVar14 + 1];
    uVar2 = pcVar8[pcVar8[iVar7].dl.dad].dl.dad;
    iVar18 = iVar6;
    if ((int)(uint)uVar2 < iVar6) {
      iVar18 = uVar2 + 1;
    }
    pcVar8[iVar7].dl.dad = (ush)iVar18;
    if (iVar7 <= iVar5) {
      this->bl_count[iVar18] = this->bl_count[iVar18] + 1;
      iVar19 = 0;
      if (iVar4 <= iVar7) {
        iVar19 = piVar10[iVar7 - iVar4];
      }
      uVar3 = pcVar8[iVar7].fc.freq;
      this->opt_len = this->opt_len + (long)(iVar18 + iVar19) * (ulong)uVar3;
      if (pcVar9 != (ct_data *)0x0) {
        this->static_len =
             this->static_len + ((long)iVar19 + (ulong)pcVar9[iVar7].dl.dad) * (ulong)uVar3;
      }
    }
    iVar16 = iVar16 + (uint)(iVar6 <= (int)(uint)uVar2);
    lVar14 = lVar14 + 1;
  }
  if (iVar16 != 0) {
    lVar17 = (lVar12 << 0x20) + 0x100000000;
    lVar14 = lVar17;
    puVar20 = this->bl_count + lVar12;
    do {
      do {
        lVar14 = lVar14 + -0x100000000;
        psVar1 = (short *)(puVar20 + -1);
        puVar20 = puVar20 + -1;
      } while (*psVar1 == 0);
      *puVar20 = *psVar1 - 1;
      psVar1 = (short *)((long)this->bl_count + (lVar14 >> 0x1f));
      *psVar1 = *psVar1 + 2;
      this->bl_count[lVar12] = this->bl_count[lVar12] - 1;
      bVar11 = 2 < iVar16;
      lVar14 = lVar17;
      puVar20 = this->bl_count + lVar12;
      iVar16 = iVar16 + -2;
    } while (bVar11);
LAB_0012ad3a:
    lVar14 = lVar12;
    if (lVar14 != 0) {
      uVar13 = (uint)this->bl_count[lVar14];
      do {
        lVar17 = 0;
        do {
          lVar12 = lVar14 + -1;
          if (uVar13 == 0) goto LAB_0012ad3a;
          iVar4 = this->heap[(long)(int)uVar15 + lVar17 + -1];
          lVar17 = lVar17 + -1;
        } while (iVar5 < iVar4);
        if (pcVar8[iVar4].dl.dad != (ushort)lVar14) {
          this->opt_len =
               this->opt_len + (ulong)pcVar8[iVar4].fc.freq * (lVar14 - (ulong)pcVar8[iVar4].dl.dad)
          ;
          pcVar8[iVar4].dl.dad = (ushort)lVar14;
        }
        uVar15 = (uVar15 & 0xffffffff) + lVar17;
        uVar13 = uVar13 - 1;
      } while( true );
    }
  }
  return;
}

Assistant:

void IZDeflate::gen_bitlen(tree_desc near *desc)
    // tree_desc near *desc; /* the tree descriptor */
{
    ct_data near *tree  = desc->dyn_tree;
    int near *extra     = desc->extra_bits;
    int base            = desc->extra_base;
    int max_code        = desc->max_code;
    int max_length      = desc->max_length;
    ct_data near *stree = desc->static_tree;
    int h;              /* heap index */
    int n, m;           /* iterate over the tree elements */
    int bits;           /* bit length */
    int xbits;          /* extra bits */
    ush f;              /* frequency */
    int overflow = 0;   /* number of elements with bit length too large */

    for (bits = 0; bits <= MAX_BITS; bits++) bl_count[bits] = 0;

    /* In a first pass, compute the optimal bit lengths (which may
     * overflow in the case of the bit length tree).
     */
    tree[heap[heap_max]].Len = 0; /* root of the heap */

    for (h = heap_max+1; h < HEAP_SIZE; h++) {
        n = heap[h];
        bits = tree[tree[n].Dad].Len + 1;
        if (bits > max_length) bits = max_length, overflow++;
        tree[n].Len = (ush)bits;
        /* We overwrite tree[n].Dad which is no longer needed */

        if (n > max_code) continue; /* not a leaf node */

        bl_count[bits]++;
        xbits = 0;
        if (n >= base) xbits = extra[n-base];
        f = tree[n].Freq;
        opt_len += (ulg)f * (bits + xbits);
        if (stree) static_len += (ulg)f * (stree[n].Len + xbits);
    }
    if (overflow == 0) return;

    Trace((stderr,"\nbit length overflow\n"));
    /* This happens for example on obj2 and pic of the Calgary corpus */

    /* Find the first bit length which could increase: */
    do {
        bits = max_length-1;
        while (bl_count[bits] == 0) bits--;
        bl_count[bits]--;           /* move one leaf down the tree */
        bl_count[bits+1] += (ush)2; /* move one overflow item as its brother */
        bl_count[max_length]--;
        /* The brother of the overflow item also moves one step up,
         * but this does not affect bl_count[max_length]
         */
        overflow -= 2;
    } while (overflow > 0);

    /* Now recompute all bit lengths, scanning in increasing frequency.
     * h is still equal to HEAP_SIZE. (It is simpler to reconstruct all
     * lengths instead of fixing only the wrong ones. This idea is taken
     * from 'ar' written by Haruhiko Okumura.)
     */
    for (bits = max_length; bits != 0; bits--) {
        n = bl_count[bits];
        while (n != 0) {
            m = heap[--h];
            if (m > max_code) continue;
            if (tree[m].Len != (ush)bits) {
                Trace((stderr,"code %d bits %d->%d\n", m, tree[m].Len, bits));
                opt_len += ((long)bits-(long)tree[m].Len)*(long)tree[m].Freq;
                tree[m].Len = (ush)bits;
            }
            n--;
        }
    }
}